

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

size_t docio_batch_read_docs
                 (docio_handle *handle,uint64_t *offset_array,docio_object *doc_array,
                 size_t array_size,size_t data_size_threshold,size_t batch_size_threshold,
                 async_io_handle *aio_handle,bool keymeta_only)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong in_RCX;
  docio_object *in_RDX;
  long in_RSI;
  docio_handle *in_RDI;
  ulong in_R8;
  ulong in_R9;
  bool bVar5;
  async_io_handle *in_stack_00000008;
  int num_sub_1;
  int num_sub;
  bool read_on_cache_miss;
  bool read_fail;
  int aio_size;
  uint64_t _offset;
  size_t block_size;
  size_t doc_idx;
  size_t sum_doc_size;
  size_t i;
  int local_6c;
  long local_68;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  byte local_39;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  docio_object *local_20;
  long local_18;
  docio_handle *local_10;
  size_t local_8;
  
  local_39 = (byte)num_sub_1 & 1;
  local_50 = 0;
  local_58 = 0;
  uVar1 = in_RDI->file->blocksize;
  local_6c = 0;
  bVar2 = false;
  local_48 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    bVar5 = false;
    if ((local_48 < local_28) && (bVar5 = false, local_48 < local_38)) {
      bVar5 = local_50 < local_30;
    }
    if (!bVar5) goto LAB_00126fcb;
    memset(local_20 + local_58,0,0x38);
    if ((local_39 & 1) == 0) {
      local_68 = docio_read_doc(handle,(uint64_t)offset_array,doc_array,array_size._7_1_);
    }
    else {
      local_68 = docio_read_doc_key_meta
                           ((docio_handle *)sum_doc_size,doc_idx,(docio_object *)block_size,
                            _offset._7_1_);
    }
    if (local_68 == 0) {
      if (in_stack_00000008 == (async_io_handle *)0x0) {
        local_58 = local_58 + 1;
      }
      else {
        (*local_10->file->ops->aio_prep_read)
                  (in_stack_00000008,(long)local_6c,(size_t)uVar1,
                   *(uint64_t *)(local_18 + local_48 * 8));
        local_6c = local_6c + 1;
        if (local_6c == (int)in_stack_00000008->queue_depth) {
          iVar3 = _submit_async_io_requests
                            (local_10,local_20,local_58,in_stack_00000008,local_6c,&local_50,
                             (bool)(local_39 & 1));
          if ((iVar3 < 0) || (iVar3 != local_6c)) {
            bVar2 = true;
LAB_00126fcb:
            if ((local_6c != 0) && (!bVar2)) {
              iVar3 = _submit_async_io_requests
                                (local_10,local_20,local_58,in_stack_00000008,local_6c,&local_50,
                                 (bool)(local_39 & 1));
              if (iVar3 < 0) {
                bVar2 = true;
              }
              else {
                local_58 = (long)iVar3 + local_58;
              }
            }
            if (bVar2) {
              for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
                free(local_20[local_48].key);
                free(local_20[local_48].meta);
                free(local_20[local_48].body);
                local_20[local_48].body = (void *)0x0;
                local_20[local_48].meta = (void *)0x0;
                local_20[local_48].key = (void *)0x0;
              }
              local_8 = 0xffffffffffffffff;
            }
            else {
              local_8 = local_58;
            }
            return local_8;
          }
          local_6c = 0;
          local_58 = (long)iVar3 + local_58;
        }
      }
    }
    else {
      sVar4 = _fdb_get_docsize(local_20[local_58].length);
      local_50 = sVar4 + local_50;
      if ((local_39 & 1) != 0) {
        local_50 = local_50 - local_20[local_58].length.bodylen_ondisk;
      }
      local_58 = local_58 + 1;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

size_t docio_batch_read_docs(struct docio_handle *handle,
                             uint64_t *offset_array,
                             struct docio_object *doc_array,
                             size_t array_size,
                             size_t data_size_threshold,
                             size_t batch_size_threshold,
                             struct async_io_handle *aio_handle,
                             bool keymeta_only)
{
    size_t i = 0;
    size_t sum_doc_size = 0;
    size_t doc_idx = 0;
    size_t block_size = handle->file->blocksize;
    uint64_t _offset = 0;
    int aio_size = 0;
    bool read_fail = false;
    bool read_on_cache_miss = true;

    if (aio_handle) {
        // If async I/O is supported, we will then read non-resident docs from disk
        // by using async I/O operations.
        read_on_cache_miss = false;
    }

    for (i = 0; i < array_size && i < batch_size_threshold &&
           sum_doc_size < data_size_threshold; ++i) {
        memset(&doc_array[doc_idx], 0x0, sizeof(struct docio_object));
        if (keymeta_only) {
            _offset = docio_read_doc_key_meta(handle, offset_array[i], &doc_array[doc_idx],
                                              read_on_cache_miss);
        } else {
            _offset = docio_read_doc(handle, offset_array[i], &doc_array[doc_idx],
                                     read_on_cache_miss);
        }
        if (_offset <= 0) {
            if (aio_handle) {
                // The page is not resident in the cache. Prepare and perform Async I/O
                handle->file->ops->aio_prep_read(aio_handle, aio_size,
                                                 block_size, offset_array[i]);
                if (++aio_size == (int) aio_handle->queue_depth) {
                    int num_sub = _submit_async_io_requests(handle, doc_array, doc_idx,
                                                            aio_handle, aio_size,
                                                            &sum_doc_size,
                                                            keymeta_only);
                    if (num_sub < 0 || num_sub != aio_size) {
                        read_fail = true;
                        break;
                    }
                    aio_size = 0;
                    doc_idx += num_sub;
                }
            } else {
                ++doc_idx; // Error in reading a doc.
            }
        } else {
            sum_doc_size += _fdb_get_docsize(doc_array[doc_idx].length);
            if (keymeta_only) {
                sum_doc_size -= doc_array[doc_idx].length.bodylen_ondisk;
            }
            ++doc_idx;
        }
    }

    if (aio_size && !read_fail) {
        int num_sub = _submit_async_io_requests(handle, doc_array, doc_idx,
                                                aio_handle, aio_size,
                                                &sum_doc_size, keymeta_only);
        if (num_sub < 0) {
            read_fail = true;
        } else {
            doc_idx += num_sub;
        }
    }

    if (read_fail) {
        for (i = 0; i < batch_size_threshold; ++i) {
            free(doc_array[i].key);
            free(doc_array[i].meta);
            free(doc_array[i].body);
            doc_array[i].key = doc_array[i].meta = doc_array[i].body = NULL;
        }
        return (size_t) -1;
    }

    return doc_idx;
}